

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O2

string * __thiscall
cmExtraCodeBlocksGenerator::GetCBCompilerId_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraCodeBlocksGenerator *this,cmMakefile *mf)

{
  cmGlobalGenerator *pcVar1;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  string compilerId;
  string compilerIdVar;
  allocator local_89;
  string local_88;
  string local_68;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  pcVar1 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  std::__cxx11::string::string((string *)&local_88,"CXX",(allocator *)&local_68);
  bVar2 = cmGlobalGenerator::GetLanguageEnabled(pcVar1,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  if (bVar2) {
LAB_00393970:
    std::__cxx11::string::assign((char *)&local_48);
LAB_0039397a:
    bVar2 = false;
  }
  else {
    pcVar1 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
    std::__cxx11::string::string((string *)&local_88,"C",(allocator *)&local_68);
    bVar2 = cmGlobalGenerator::GetLanguageEnabled(pcVar1,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    if (bVar2) goto LAB_00393970;
    pcVar1 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
    std::__cxx11::string::string((string *)&local_88,"Fortran",(allocator *)&local_68);
    bVar2 = cmGlobalGenerator::GetLanguageEnabled(pcVar1,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    if (!bVar2) goto LAB_0039397a;
    bVar2 = true;
    std::__cxx11::string::assign((char *)&local_48);
  }
  pcVar4 = cmMakefile::GetSafeDefinition(mf,&local_48);
  std::__cxx11::string::string((string *)&local_88,pcVar4,(allocator *)&local_68);
  std::__cxx11::string::string((string *)__return_storage_ptr__,"gcc",(allocator *)&local_68);
  bVar3 = std::operator==(&local_88,"MSVC");
  if (bVar3) {
    std::__cxx11::string::string((string *)&local_68,"MSVC10",&local_89);
    cmMakefile::IsDefinitionSet(mf,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  else {
    bVar3 = std::operator==(&local_88,"Borland");
    if ((!bVar3) && (bVar3 = std::operator==(&local_88,"SDCC"), !bVar3)) {
      bVar3 = std::operator==(&local_88,"Intel");
      if (bVar3) {
        if (bVar2) {
          std::__cxx11::string::string((string *)&local_68,"WIN32",&local_89);
          cmMakefile::IsDefinitionSet(mf,&local_68);
          std::__cxx11::string::~string((string *)&local_68);
        }
      }
      else {
        bVar2 = std::operator==(&local_88,"Watcom");
        if ((((!bVar2) && (bVar2 = std::operator==(&local_88,"OpenWatcom"), !bVar2)) &&
            (bVar2 = std::operator==(&local_88,"Clang"), !bVar2)) &&
           ((bVar2 = std::operator==(&local_88,"PGI"), !bVar2 &&
            (bVar2 = std::operator==(&local_88,"GNU"), !bVar2)))) goto LAB_00393b63;
      }
    }
  }
  std::__cxx11::string::assign((char *)__return_storage_ptr__);
LAB_00393b63:
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraCodeBlocksGenerator::GetCBCompilerId(const cmMakefile* mf)
{
  // figure out which language to use
  // for now care only for C, C++, and Fortran

  // projects with C/C++ and Fortran are handled as C/C++ projects
  bool pureFortran = false;
  std::string compilerIdVar;
  if (this->GlobalGenerator->GetLanguageEnabled("CXX")) {
    compilerIdVar = "CMAKE_CXX_COMPILER_ID";
  } else if (this->GlobalGenerator->GetLanguageEnabled("C")) {
    compilerIdVar = "CMAKE_C_COMPILER_ID";
  } else if (this->GlobalGenerator->GetLanguageEnabled("Fortran")) {
    compilerIdVar = "CMAKE_Fortran_COMPILER_ID";
    pureFortran = true;
  }

  std::string compilerId = mf->GetSafeDefinition(compilerIdVar);
  std::string compiler = "gcc"; // default to gcc
  if (compilerId == "MSVC") {
    if (mf->IsDefinitionSet("MSVC10")) {
      compiler = "msvc10";
    } else {
      compiler = "msvc8";
    }
  } else if (compilerId == "Borland") {
    compiler = "bcc";
  } else if (compilerId == "SDCC") {
    compiler = "sdcc";
  } else if (compilerId == "Intel") {
    if (pureFortran && mf->IsDefinitionSet("WIN32")) {
      compiler = "ifcwin"; // Intel Fortran for Windows (known by cbFortran)
    } else {
      compiler = "icc";
    }
  } else if (compilerId == "Watcom" || compilerId == "OpenWatcom") {
    compiler = "ow";
  } else if (compilerId == "Clang") {
    compiler = "clang";
  } else if (compilerId == "PGI") {
    if (pureFortran) {
      compiler = "pgifortran";
    } else {
      compiler = "pgi"; // does not exist as default in CodeBlocks 16.01
    }
  } else if (compilerId == "GNU") {
    if (pureFortran) {
      compiler = "gfortran";
    } else {
      compiler = "gcc";
    }
  }
  return compiler;
}